

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegCompactPushString(xmlRegExecCtxtPtr exec,xmlRegexpPtr comp,xmlChar *value,void *data)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  xmlChar **ppxVar4;
  int iVar5;
  uint uVar6;
  xmlChar *pxVar7;
  ulong uVar8;
  long lVar9;
  
  uVar6 = 0xffffffff;
  if (((comp != (xmlRegexpPtr)0x0) &&
      (piVar3 = comp->compact, uVar6 = 0xffffffff, piVar3 != (int *)0x0)) &&
     (ppxVar4 = comp->stringMap, ppxVar4 != (xmlChar **)0x0)) {
    iVar1 = exec->index;
    uVar6 = comp->nbstrings;
    if (value == (xmlChar *)0x0) {
      uVar6 = (uint)(piVar3[(int)((uVar6 + 1) * iVar1)] == 2);
    }
    else {
      if (0 < (int)uVar6) {
        uVar8 = 0;
        do {
          iVar2 = piVar3[(long)(int)((uVar6 + 1) * iVar1) + uVar8 + 1];
          if (((0 < (long)iVar2) && (iVar2 <= comp->nbstates)) &&
             (iVar5 = xmlRegStrEqualWildcard(ppxVar4[uVar8],value), iVar5 != 0)) {
            lVar9 = (long)iVar2 + -1;
            exec->index = (int)lVar9;
            if ((exec->callback != (xmlRegExecCallbacks)0x0) && (comp->transdata != (void **)0x0)) {
              (*exec->callback)((xmlRegExecCtxtPtr)exec->data,value,
                                comp->transdata[(int)((int)uVar8 + uVar6 * iVar1)],data);
            }
            if (comp->compact[((long)comp->nbstrings + 1) * lVar9] == 2) {
              return 1;
            }
            if (comp->compact[((long)comp->nbstrings + 1) * lVar9] != 4) {
              return 0;
            }
            break;
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      if (exec->errString != (xmlChar *)0x0) {
        (*xmlFree)(exec->errString);
      }
      pxVar7 = xmlStrdup(value);
      exec->errString = pxVar7;
      exec->errStateNo = iVar1;
      exec->status = -1;
      uVar6 = 0xffffffff;
    }
  }
  return uVar6;
}

Assistant:

static int
xmlRegCompactPushString(xmlRegExecCtxtPtr exec,
	                xmlRegexpPtr comp,
	                const xmlChar *value,
	                void *data) {
    int state = exec->index;
    int i, target;

    if ((comp == NULL) || (comp->compact == NULL) || (comp->stringMap == NULL))
	return(-1);

    if (value == NULL) {
	/*
	 * are we at a final state ?
	 */
	if (comp->compact[state * (comp->nbstrings + 1)] ==
            XML_REGEXP_FINAL_STATE)
	    return(1);
	return(0);
    }

#ifdef DEBUG_PUSH
    printf("value pushed: %s\n", value);
#endif

    /*
     * Examine all outside transitions from current state
     */
    for (i = 0;i < comp->nbstrings;i++) {
	target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	if ((target > 0) && (target <= comp->nbstates)) {
	    target--; /* to avoid 0 */
	    if (xmlRegStrEqualWildcard(comp->stringMap[i], value)) {
		exec->index = target;
		if ((exec->callback != NULL) && (comp->transdata != NULL)) {
		    exec->callback(exec->data, value,
			  comp->transdata[state * comp->nbstrings + i], data);
		}
#ifdef DEBUG_PUSH
		printf("entering state %d\n", target);
#endif
		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_SINK_STATE)
		    goto error;

		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_FINAL_STATE)
		    return(1);
		return(0);
	    }
	}
    }
    /*
     * Failed to find an exit transition out from current state for the
     * current token
     */
#ifdef DEBUG_PUSH
    printf("failed to find a transition for %s on state %d\n", value, state);
#endif
error:
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    exec->errString = xmlStrdup(value);
    exec->errStateNo = state;
    exec->status = -1;
#ifdef DEBUG_ERR
    testerr(exec);
#endif
    return(-1);
}